

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestMessageMapLite::ByteSizeLong(TestMessageMapLite *this)

{
  bool bVar1;
  int iVar2;
  Map<int,_proto2_unittest::TestAllTypesLite> *this_00;
  reference key;
  size_t sVar3;
  long lVar4;
  value_type *entry;
  const_iterator __end2;
  const_iterator __begin2;
  Map<int,_proto2_unittest::TestAllTypesLite> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMessageMapLite *this_;
  TestMessageMapLite *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_map_int32_message_size(this);
  sStack_58 = google::protobuf::internal::FromIntSize(iVar2);
  this_00 = _internal_map_int32_message(this);
  google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::begin
            ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,this_00);
  google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::end
            ((const_iterator *)&entry,this_00);
  while (bVar1 = google::protobuf::operator!=
                           ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_,
                            (const_iterator *)&entry), bVar1) {
    key = google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::const_iterator::operator*
                    ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_unittest::TestAllTypesLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(&key->first,&key->second);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::const_iterator::operator++
              ((const_iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    sStack_58 = lVar4 + sStack_58;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,iVar2);
  return sStack_58;
}

Assistant:

::size_t TestMessageMapLite::ByteSizeLong() const {
  const TestMessageMapLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMessageMapLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, .proto2_unittest.TestAllTypesLite> map_int32_message = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_message_size());
      for (const auto& entry : this_._internal_map_int32_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::TestAllTypesLite,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}